

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_between_face_area(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,char *msg)

{
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  REF_INT sense;
  REF_DBL uv [2];
  REF_INT ncell;
  REF_INT id;
  REF_DBL uv_area31;
  REF_DBL uv_area30;
  REF_DBL uv_area21;
  REF_DBL uv_area20;
  REF_DBL uv_area3;
  REF_DBL uv_area2;
  REF_INT cells [2];
  REF_DBL uv_area_sign;
  REF_INT nodes3 [27];
  REF_INT nodes2 [27];
  REF_INT local_1bc;
  REF_INT local_1b8;
  REF_INT local_1b4;
  REF_GEOM local_1b0;
  REF_DBL local_1a8;
  undefined8 local_1a0;
  double local_198;
  int local_190;
  REF_INT local_18c;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  REF_INT local_130;
  REF_INT local_12c;
  char *local_128;
  double local_120;
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  local_1b4 = node1;
  local_128 = msg;
  uVar2 = ref_geom_unique_id(ref_geom,new_node,2,&local_18c);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",1000,
           "ref_geom_between_face_area",(ulong)uVar2,"unique face id");
    return uVar2;
  }
  local_1b8 = node0;
  local_1b0 = ref_geom;
  uVar2 = ref_geom_uv_area_sign(ref_grid,local_18c,&local_120);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3ea,
           "ref_geom_between_face_area",(ulong)uVar2,"uv area sign");
    return uVar2;
  }
  uVar2 = ref_cell_list_with2(ref_cell,local_1b8,local_1b4,2,&local_190,&local_130);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3ec,
           "ref_geom_between_face_area",(ulong)uVar2,"list");
    return uVar2;
  }
  lVar4 = (long)local_190;
  if (lVar4 != 2) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3ed,
           "ref_geom_between_face_area","expected two tri for box2 nodes",2,lVar4);
  }
  uVar2 = (uint)(lVar4 != 2);
  if (local_190 != 2) {
    return uVar2;
  }
  uVar3 = ref_cell_nodes(ref_cell,local_130,local_a8);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3ee,
           "ref_geom_between_face_area",(ulong)uVar3,"cell nodes");
    return uVar3;
  }
  uVar3 = ref_cell_nodes(ref_cell,local_12c,local_118);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3ef,
           "ref_geom_between_face_area",(ulong)uVar3,"cell nodes");
    return uVar3;
  }
  uVar3 = ref_geom_uv_area(local_1b0,local_a8,&local_138);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3f1,
           "ref_geom_between_face_area",(ulong)uVar3,"uv area 2");
    return uVar3;
  }
  local_198 = local_120;
  local_168 = local_138 * local_120;
  local_138 = local_168;
  uVar3 = ref_geom_uv_area(local_1b0,local_118,&local_140);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3f3,
           "ref_geom_between_face_area",(ulong)uVar3,"uv area 3");
    return uVar3;
  }
  local_170 = local_140 * local_198;
  if (0 < ref_cell->node_per) {
    lVar4 = 0;
    do {
      if (local_a8[lVar4] == local_1b8) {
        local_a8[lVar4] = new_node;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_cell->node_per);
  }
  local_140 = local_170;
  uVar3 = ref_geom_uv_area(local_1b0,local_a8,&local_148);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3f8,
           "ref_geom_between_face_area",(ulong)uVar3,"uv area 2 node 0");
    return uVar3;
  }
  local_178 = local_148 * local_198;
  if (0 < ref_cell->node_per) {
    lVar4 = 0;
    do {
      if (local_a8[lVar4] == new_node) {
        local_a8[lVar4] = local_1b8;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_cell->node_per);
  }
  if (0 < ref_cell->node_per) {
    lVar4 = 0;
    do {
      if (local_a8[lVar4] == local_1b4) {
        local_a8[lVar4] = new_node;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_cell->node_per);
  }
  local_148 = local_178;
  uVar3 = ref_geom_uv_area(local_1b0,local_a8,&local_150);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3fe,
           "ref_geom_between_face_area",(ulong)uVar3,"uv area 2 node 1");
    return uVar3;
  }
  local_180 = local_150 * local_198;
  if (0 < ref_cell->node_per) {
    lVar4 = 0;
    do {
      if (local_a8[lVar4] == new_node) {
        local_a8[lVar4] = local_1b4;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_cell->node_per);
  }
  if (0 < ref_cell->node_per) {
    lVar4 = 0;
    do {
      if (local_118[lVar4] == local_1b8) {
        local_118[lVar4] = new_node;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_cell->node_per);
  }
  local_150 = local_180;
  uVar3 = ref_geom_uv_area(local_1b0,local_118,&local_158);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x405,
           "ref_geom_between_face_area",(ulong)uVar3,"uv area 3 node 0");
    return uVar3;
  }
  local_188 = local_158 * local_198;
  if (0 < ref_cell->node_per) {
    lVar4 = 0;
    do {
      if (local_118[lVar4] == new_node) {
        local_118[lVar4] = local_1b8;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_cell->node_per);
  }
  if (0 < ref_cell->node_per) {
    lVar4 = 0;
    do {
      if (local_118[lVar4] == local_1b4) {
        local_118[lVar4] = new_node;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_cell->node_per);
  }
  local_158 = local_188;
  uVar3 = ref_geom_uv_area(local_1b0,local_118,&local_160);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x40b,
           "ref_geom_between_face_area",(ulong)uVar3,"uv area 3 node 1");
    return uVar3;
  }
  local_160 = local_198 * local_160;
  if (0 < ref_cell->node_per) {
    lVar4 = 0;
    do {
      if (local_118[lVar4] == new_node) {
        local_118[lVar4] = local_1b4;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_cell->node_per);
  }
  if ((((1e-20 < local_168) && (1e-20 < local_170)) && (0.0 < local_178)) &&
     (((0.0 < local_180 && (0.0 < local_188)) && (0.0 < local_160)))) {
    return 0;
  }
  printf("%s orig uv area %e %e new %e %e %e %e\n",local_168,local_170,local_178,local_180,local_188
         ,local_128);
  if (0 < ref_cell->node_per) {
    lVar4 = 0;
    do {
      if (local_a8[lVar4] == local_1b8) {
        local_a8[lVar4] = new_node;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_cell->node_per);
  }
  uVar3 = ref_geom_cell_tuv(local_1b0,local_a8[0],local_a8,2,&local_1a8,&local_1bc);
  if (uVar3 == 0) {
    printf("20uv %.18e %.18e\n",local_1a8,local_1a0);
    uVar3 = ref_geom_cell_tuv(local_1b0,local_a8[1],local_a8,2,&local_1a8,&local_1bc);
    if (uVar3 == 0) {
      printf("20uv %.18e %.18e\n",local_1a8,local_1a0);
      uVar3 = ref_geom_cell_tuv(local_1b0,local_a8[2],local_a8,2,&local_1a8,&local_1bc);
      if (uVar3 == 0) {
        printf("20uv %.18e %.18e\n",local_1a8,local_1a0);
        if (0 < ref_cell->node_per) {
          lVar4 = 0;
          do {
            if (local_a8[lVar4] == new_node) {
              local_a8[lVar4] = local_1b8;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < ref_cell->node_per);
        }
        if (0 < ref_cell->node_per) {
          lVar4 = 0;
          do {
            if (local_a8[lVar4] == local_1b4) {
              local_a8[lVar4] = new_node;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < ref_cell->node_per);
        }
        uVar3 = ref_geom_cell_tuv(local_1b0,local_a8[0],local_a8,2,&local_1a8,&local_1bc);
        if (uVar3 == 0) {
          printf("21uv %.18e %.18e\n",local_1a8,local_1a0);
          uVar3 = ref_geom_cell_tuv(local_1b0,local_a8[1],local_a8,2,&local_1a8,&local_1bc);
          if (uVar3 == 0) {
            printf("21uv %.18e %.18e\n",local_1a8,local_1a0);
            uVar3 = ref_geom_cell_tuv(local_1b0,local_a8[2],local_a8,2,&local_1a8,&local_1bc);
            if (uVar3 == 0) {
              printf("21uv %.18e %.18e\n",local_1a8,local_1a0);
              if (0 < ref_cell->node_per) {
                lVar4 = 0;
                do {
                  if (local_a8[lVar4] == new_node) {
                    local_a8[lVar4] = local_1b4;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 < ref_cell->node_per);
              }
              if (0 < ref_cell->node_per) {
                lVar4 = 0;
                do {
                  if (local_118[lVar4] == local_1b8) {
                    local_118[lVar4] = new_node;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 < ref_cell->node_per);
              }
              uVar3 = ref_geom_cell_tuv(local_1b0,local_118[0],local_118,2,&local_1a8,&local_1bc);
              if (uVar3 == 0) {
                printf("30uv %.18e %.18e\n",local_1a8,local_1a0);
                uVar3 = ref_geom_cell_tuv(local_1b0,local_118[1],local_118,2,&local_1a8,&local_1bc);
                if (uVar3 == 0) {
                  printf("30uv %.18e %.18e\n",local_1a8,local_1a0);
                  uVar3 = ref_geom_cell_tuv(local_1b0,local_118[2],local_118,2,&local_1a8,&local_1bc
                                           );
                  if (uVar3 == 0) {
                    printf("30uv %.18e %.18e\n",local_1a8,local_1a0);
                    if (0 < ref_cell->node_per) {
                      lVar4 = 0;
                      do {
                        if (local_118[lVar4] == new_node) {
                          local_118[lVar4] = local_1b8;
                        }
                        lVar4 = lVar4 + 1;
                      } while (lVar4 < ref_cell->node_per);
                    }
                    if (0 < ref_cell->node_per) {
                      lVar4 = 0;
                      do {
                        if (local_118[lVar4] == local_1b4) {
                          local_118[lVar4] = new_node;
                        }
                        lVar4 = lVar4 + 1;
                      } while (lVar4 < ref_cell->node_per);
                    }
                    uVar3 = ref_geom_cell_tuv(local_1b0,local_118[0],local_118,2,&local_1a8,
                                              &local_1bc);
                    if (uVar3 == 0) {
                      printf("31uv %.18e %.18e\n",local_1a8,local_1a0);
                      uVar3 = ref_geom_cell_tuv(local_1b0,local_118[1],local_118,2,&local_1a8,
                                                &local_1bc);
                      if (uVar3 == 0) {
                        printf("31uv %.18e %.18e\n",local_1a8,local_1a0);
                        uVar3 = ref_geom_cell_tuv(local_1b0,local_118[2],local_118,2,&local_1a8,
                                                  &local_1bc);
                        if (uVar3 == 0) {
                          printf("31uv %.18e %.18e\n",local_1a8,local_1a0);
                          bVar1 = true;
                          if (0 < ref_cell->node_per) {
                            lVar4 = 0;
                            do {
                              if (local_118[lVar4] == new_node) {
                                local_118[lVar4] = local_1b4;
                              }
                              lVar4 = lVar4 + 1;
                            } while (lVar4 < ref_cell->node_per);
                          }
                          goto LAB_00153cfb;
                        }
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x448,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
                        uVar2 = uVar3;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x445,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
                        uVar2 = uVar3;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x442,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
                      uVar2 = uVar3;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0x43b,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
                    uVar2 = uVar3;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0x438,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
                  uVar2 = uVar3;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x435,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
                uVar2 = uVar3;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x42d,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
              uVar2 = uVar3;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x42a,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
            uVar2 = uVar3;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x427,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
          uVar2 = uVar3;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x420,"ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
        uVar2 = uVar3;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x41d,
             "ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
      uVar2 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x41a,
           "ref_geom_between_face_area",(ulong)uVar3,"cell uv0");
    uVar2 = uVar3;
  }
  bVar1 = false;
LAB_00153cfb:
  if (bVar1) {
    return 0;
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_between_face_area(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              const char *msg) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT nodes2[REF_CELL_MAX_SIZE_PER];
  REF_INT nodes3[REF_CELL_MAX_SIZE_PER];
  REF_INT type, id, node;
  REF_INT ncell, cells[2];
  REF_DBL uv_area2, uv_area3, uv_area_sign;
  REF_DBL uv_area20, uv_area21;
  REF_DBL uv_area30, uv_area31;

  type = REF_GEOM_FACE;
  RSS(ref_geom_unique_id(ref_geom, new_node, type, &id), "unique face id");

  RSS(ref_geom_uv_area_sign(ref_grid, id, &uv_area_sign), "uv area sign");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");
  RSS(ref_cell_nodes(ref_cell, cells[0], nodes2), "cell nodes");
  RSS(ref_cell_nodes(ref_cell, cells[1], nodes3), "cell nodes");

  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area2), "uv area 2");
  uv_area2 *= uv_area_sign;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area3), "uv area 3");
  uv_area3 *= uv_area_sign;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node0 == nodes2[node]) nodes2[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area20), "uv area 2 node 0");
  uv_area20 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes2[node]) nodes2[node] = node0;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node1 == nodes2[node]) nodes2[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes2, &uv_area21), "uv area 2 node 1");
  uv_area21 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes2[node]) nodes2[node] = node1;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node0 == nodes3[node]) nodes3[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area30), "uv area 3 node 0");
  uv_area30 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes3[node]) nodes3[node] = node0;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (node1 == nodes3[node]) nodes3[node] = new_node;
  RSS(ref_geom_uv_area(ref_geom, nodes3, &uv_area31), "uv area 3 node 1");
  uv_area31 *= uv_area_sign;
  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    if (new_node == nodes3[node]) nodes3[node] = node1;

  if (uv_area2 <= 1e-20 || uv_area3 <= 1e-20 || uv_area20 <= 0 ||
      uv_area21 <= 0 || uv_area30 <= 0 || uv_area31 <= 0) {
    REF_DBL uv[2];
    REF_DBL u0 = 0.0, v0 = 0.0;
    REF_INT sense;
    printf("%s orig uv area %e %e new %e %e %e %e\n", msg, uv_area2, uv_area3,
           uv_area20, uv_area21, uv_area30, uv_area31);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes2[node]) nodes2[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[0], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[1], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[2], nodes2, type, uv, &sense),
        "cell uv0");
    printf("20uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes2[node]) nodes2[node] = node0;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes2[node]) nodes2[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[0], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[1], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes2[2], nodes2, type, uv, &sense),
        "cell uv0");
    printf("21uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes2[node]) nodes2[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes3[node]) nodes3[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[0], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[1], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[2], nodes3, type, uv, &sense),
        "cell uv0");
    printf("30uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes3[node]) nodes3[node] = node0;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes3[node]) nodes3[node] = new_node;
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[0], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[1], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    RSS(ref_geom_cell_tuv(ref_geom, nodes3[2], nodes3, type, uv, &sense),
        "cell uv0");
    printf("31uv %.18e %.18e\n", uv[0] - u0, uv[1] - v0);
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes3[node]) nodes3[node] = node1;
  }

  return REF_SUCCESS;
}